

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcp.cc
# Opt level: O3

int main(int argc,char **argv)

{
  uint16_t port;
  long lVar1;
  pointer pHVar2;
  Log *pLVar3;
  ulong uVar4;
  long lVar5;
  vector<common::Host,_std::allocator<common::Host>_> hosts;
  Config config;
  XcpOptions options;
  SSH2Client client;
  vector<common::Host,_std::allocator<common::Host>_> local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  Config local_268;
  XcpOptions local_230;
  SSH2Client local_110;
  
  common::Options::Options(&local_230.super_Options);
  local_230.remote_path._M_dataplus._M_p = (pointer)&local_230.remote_path.field_2;
  local_230.remote_path._M_string_length = 0;
  local_230.remote_path.field_2._M_local_buf[0] = '\0';
  local_230.local_path._M_dataplus._M_p = (pointer)&local_230.local_path.field_2;
  local_230.local_path._M_string_length = 0;
  local_230.local_path.field_2._M_local_buf[0] = '\0';
  local_230.remote_to_local = false;
  local_230.local_to_remote = false;
  XcpOptions::Init(&local_230,argc,argv);
  if (local_230.super_Options.log_file._M_string_length != 0) {
    pLVar3 = xlib::Log::Instance();
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,local_230.super_Options.log_file._M_dataplus._M_p,
               local_230.super_Options.log_file._M_dataplus._M_p +
               local_230.super_Options.log_file._M_string_length);
    xlib::Log::SetLogFile(pLVar3,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p);
    }
  }
  if (0 < local_230.super_Options.log_level) {
    pLVar3 = xlib::Log::Instance();
    xlib::Log::SetLogPriority(pLVar3,local_230.super_Options.log_level);
  }
  local_268.m_group_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.m_group_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.m_hosts.
  super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.m_group_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.m_hosts.
  super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.m_hosts.
  super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  common::Config::Init(&local_268,&local_230.super_Options.config_file);
  local_3a8.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  common::Config::GetHostsByOptions(&local_268,&local_230.super_Options,&local_3a8);
  if (local_3a8.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_3a8.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar5 = 0x80;
    uVar4 = 0;
    do {
      pHVar2 = local_3a8.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      lVar1 = *(long *)((long)local_3a8.
                              super__Vector_base<common::Host,_std::allocator<common::Host>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar5 + -0x60);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a8,lVar1,
                 *(long *)((long)local_3a8.
                                 super__Vector_base<common::Host,_std::allocator<common::Host>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar5 + -0x58) + lVar1);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      lVar1 = *(long *)((long)pHVar2 + lVar5 + -0x40);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,lVar1,*(long *)((long)pHVar2 + lVar5 + -0x38) + lVar1);
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      lVar1 = *(long *)((long)pHVar2 + lVar5 + -0x20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_348,lVar1,*(long *)((long)pHVar2 + lVar5 + -0x18) + lVar1);
      port = *(uint16_t *)((long)&(pHVar2->alias)._M_dataplus._M_p + lVar5);
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      lVar1 = *(long *)((long)pHVar2 + lVar5 + -0x80);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e8,lVar1,*(long *)((long)pHVar2 + lVar5 + -0x78) + lVar1);
      common::SSH2Client::SSH2Client(&local_110,&local_2a8,&local_2c8,&local_348,port,&local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      common::SSH2Client::Open(&local_110,true);
      if (local_230.remote_to_local == true) {
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_368,local_230.local_path._M_dataplus._M_p,
                   local_230.local_path._M_dataplus._M_p + local_230.local_path._M_string_length);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_230.remote_path._M_dataplus._M_p,
                   local_230.remote_path._M_dataplus._M_p + local_230.remote_path._M_string_length);
        common::SSH2Client::Copy(&local_110,&local_368,&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p);
        }
      }
      if (local_230.local_to_remote == true) {
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_388,local_230.local_path._M_dataplus._M_p,
                   local_230.local_path._M_dataplus._M_p + local_230.local_path._M_string_length);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_328,local_230.remote_path._M_dataplus._M_p,
                   local_230.remote_path._M_dataplus._M_p + local_230.remote_path._M_string_length);
        common::SSH2Client::Send(&local_110,&local_388,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p);
        }
      }
      common::SSH2Client::~SSH2Client(&local_110);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0xc0;
    } while (uVar4 < (ulong)(((long)local_3a8.
                                    super__Vector_base<common::Host,_std::allocator<common::Host>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_3a8.
                                    super__Vector_base<common::Host,_std::allocator<common::Host>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 6) *
                            -0x5555555555555555));
  }
  std::vector<common::Host,_std::allocator<common::Host>_>::~vector(&local_3a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268.m_group_names);
  std::vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>::
  ~vector(&local_268.m_hosts);
  XcpOptions::~XcpOptions(&local_230);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    XcpOptions options;
    options.Init(argc, argv);

    if (options.log_file.empty() == false) {
        xlib::Log::Instance().SetLogFile(options.log_file);
    }
    if (options.log_level > 0) {
        xlib::Log::Instance().SetLogPriority(xlib::LOG_PRIORITY(options.log_level));
    }

    common::Config config;
    config.Init(options.config_file);

    std::vector<common::Host> hosts;
    config.GetHostsByOptions(options, &hosts);
    for (size_t i = 0; i < hosts.size(); i++) {
        common::Host& host = hosts[i];
        common::SSH2Client client(
            host.user, host.password, host.ip, host.port, host.alias);
        client.Open();
        if (options.remote_to_local) {
            client.Copy(options.local_path, options.remote_path);
        }
        if (options.local_to_remote) {
            client.Send(options.local_path, options.remote_path);
        }
    }
    return 0;
}